

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MassDensityZ.cpp
# Opt level: O3

void __thiscall OpenMD::MassDensityZ::writeMassDensityZ(MassDensityZ *this)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  char cVar6;
  double *pdVar7;
  double *pdVar8;
  ostream *poVar9;
  pointer pdVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  ofstream rdfStream;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  pdVar4 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar14 = 0.0;
  dVar17 = 0.0;
  pdVar3 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar7 = pdVar3; pdVar7 != pdVar4; pdVar7 = pdVar7 + 1) {
    dVar17 = dVar17 + *pdVar7;
  }
  pdVar7 = (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar7 != pdVar5) {
    dVar14 = 0.0;
    pdVar8 = pdVar7;
    do {
      dVar14 = dVar14 + *pdVar8;
      pdVar8 = pdVar8 + 1;
    } while (pdVar8 != pdVar5);
  }
  std::ofstream::ofstream
            (&local_230,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 == '\0') {
    snprintf(painCave.errMsg,2000,"MassDensityZ: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#MassDensity(",0xd);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->axisLabel_)._M_dataplus._M_p,
                        (this->axisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#nFrames:\t",10);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_230,this->nProcessed_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#selection: (",0xd);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->selectionScript_)._M_dataplus._M_p,
                        (this->selectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->axisLabel_)._M_dataplus._M_p,
                        (this->axisLabel_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\tdensity (g cm^-3)\n",0x13);
    *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 8;
    pdVar10 = (this->massZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->massZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar10) {
      lVar12 = (long)pdVar4 - (long)pdVar3;
      lVar13 = lVar12 >> 3;
      auVar15._8_4_ = (int)(lVar12 >> 0x23);
      auVar15._0_8_ = lVar13;
      auVar15._12_4_ = 0x45300000;
      lVar12 = (long)pdVar5 - (long)pdVar7 >> 3;
      auVar16._8_4_ = (int)((long)pdVar5 - (long)pdVar7 >> 0x23);
      auVar16._0_8_ = lVar12;
      auVar16._12_4_ = 0x45300000;
      dVar17 = dVar17 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0));
      uVar11 = 0;
      do {
        dVar18 = (double)(this->super_StaticAnalyser).nBins_;
        dVar1 = pdVar10[uVar11];
        iVar2 = this->nProcessed_;
        poVar9 = std::ostream::_M_insert<double>((((double)uVar11 + 0.5) * dVar17) / dVar18);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
        poVar9 = std::ostream::_M_insert<double>
                           ((dVar1 * 1.66053886) /
                            ((((dVar14 / ((auVar16._8_8_ - 1.9342813113834067e+25) +
                                         ((double)CONCAT44(0x43300000,(int)lVar12) -
                                         4503599627370496.0))) * dVar17) / dVar18) * (double)iVar2))
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        uVar11 = (ulong)((int)uVar11 + 1);
        pdVar10 = (this->massZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar11 < (ulong)((long)(this->massZ_).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pdVar10 >> 3));
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void MassDensityZ::writeMassDensityZ() {
    // compute average box length:
    std::vector<RealType>::iterator j;
    RealType zSum = 0.0;
    for (j = zBox_.begin(); j != zBox_.end(); ++j) {
      zSum += *j;
    }
    RealType zAve = zSum / zBox_.size();

    RealType areaSum = 0.0;
    for (j = areas_.begin(); j != areas_.end(); ++j) {
      areaSum += *j;
    }
    RealType areaAve = areaSum / areas_.size();

    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#MassDensity(" << axisLabel_ << ")\n";
      rdfStream << "#nFrames:\t" << nProcessed_ << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "#" << axisLabel_ << "\tdensity (g cm^-3)\n";
      rdfStream.precision(8);  // same precision as the RNEMD files

      RealType massDensity;
      for (unsigned int i = 0; i < massZ_.size(); ++i) {
        RealType z = zAve * (i + 0.5) / nBins_;

        RealType volSlice = areaAve * zAve / nBins_;

        massDensity =
            Constants::densityConvert * massZ_[i] / (volSlice * nProcessed_);

        rdfStream << z << "\t" << massDensity << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MassDensityZ: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }